

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O3

void __thiscall Matrix4f::setCol(Matrix4f *this,int j,Vector4f *v)

{
  float fVar1;
  
  fVar1 = Vector4f::x(v);
  this->m_elements[j * 4] = fVar1;
  fVar1 = Vector4f::y(v);
  this->m_elements[j * 4 + 1] = fVar1;
  fVar1 = Vector4f::z(v);
  this->m_elements[j * 4 + 2] = fVar1;
  fVar1 = Vector4f::w(v);
  this->m_elements[j * 4 + 3] = fVar1;
  return;
}

Assistant:

void Matrix4f::setCol( int j, const Vector4f& v )
{
	int colStart = 4 * j;

	m_elements[ colStart ] = v.x();
	m_elements[ colStart + 1 ] = v.y();
	m_elements[ colStart + 2 ] = v.z();
	m_elements[ colStart + 3 ] = v.w();
}